

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O2

double MaxNorm_V(Vector *V)

{
  LASErrIdType LVar1;
  ulong uVar2;
  double dVar3;
  double local_10;
  
  V_Lock(V);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    local_10 = 0.0;
    for (uVar2 = 1; uVar2 <= V->Dim; uVar2 = uVar2 + 1) {
      dVar3 = ABS(V->Cmp[uVar2]);
      if (ABS(V->Cmp[uVar2]) <= local_10) {
        dVar3 = local_10;
      }
      local_10 = dVar3;
    }
    local_10 = local_10 * V->Multipl;
  }
  else {
    local_10 = 1.0;
  }
  V_Unlock(V);
  return local_10;
}

Assistant:

double MaxNorm_V(Vector *V)
/* SRes = max-Norm of the vector V */
{
    double SRes;

    double MaxCmp, Cmp;
    size_t Dim, Ind;
    Real *VCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        Dim = V->Dim;
        VCmp = V->Cmp;
        MaxCmp = 0.0;
        for_AllCmp {
           Cmp = fabs(VCmp[Ind]);
           if (Cmp > MaxCmp) 
               MaxCmp = Cmp;
        }
        MaxCmp *= V->Multipl;
        SRes = MaxCmp;
    } else {
        SRes = 1.0;
    }

    V_Unlock(V);

    return(SRes);
}